

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::AddInterfaceEntries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,string *prop,
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          *entries)

{
  pointer *__rhs;
  auto_ptr<cmCompiledGeneratorExpression> aVar1;
  LinkImplementationLibraries *pLVar2;
  cmListFileBacktrace *backtrace;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> local_d0;
  vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
  *local_c8;
  string *local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string genex;
  
  local_c8 = (vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
              *)entries;
  local_c0 = prop;
  pLVar2 = cmTarget::GetLinkImplementationLibraries(thisTarget,config);
  if (pLVar2 != (LinkImplementationLibraries *)0x0) {
    local_b8 = (pLVar2->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    backtrace = &((pLVar2->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start)->Backtrace;
    while( true ) {
      __rhs = &backtrace[-1].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
               super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pointer)__rhs == local_b8) break;
      if (backtrace[-1].Snapshot.Position.Position != 0) {
        std::operator+(&local_b0,"$<TARGET_PROPERTY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                       &local_b0,",");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                       local_c0);
        std::operator+(&genex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ge,">");
        std::__cxx11::string::~string((string *)&ge);
        std::__cxx11::string::~string((string *)&cge);
        std::__cxx11::string::~string((string *)&local_b0);
        cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace);
        cmGeneratorExpression::Parse
                  ((cmGeneratorExpression *)&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
        cge.x_ = (cmCompiledGeneratorExpression *)local_b0._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)0x0;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
        aVar1 = cge;
        (cge.x_)->EvaluateForBuildsystem = true;
        local_b0._M_dataplus._M_p = (pointer)operator_new(0x10);
        cge.x_ = (cmCompiledGeneratorExpression *)0x0;
        local_d0.x_ = (cmCompiledGeneratorExpression *)0x0;
        (((cmCompiledGeneratorExpression *)local_b0._M_dataplus._M_p)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)aVar1.x_;
        (((cmCompiledGeneratorExpression *)local_b0._M_dataplus._M_p)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)__rhs;
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                  (local_c8,(TargetPropertyEntry **)&local_b0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_d0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
        std::__cxx11::string::~string((string *)&genex);
      }
      backtrace = backtrace + 2;
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddInterfaceEntries(
  cmTarget const* thisTarget, std::string const& config,
  std::string const& prop, std::vector<TargetPropertyEntry*>& entries)
{
  if(cmTarget::LinkImplementationLibraries const* impl =
     thisTarget->GetLinkImplementationLibraries(config))
    {
    for (std::vector<cmLinkImplItem>::const_iterator
           it = impl->Libraries.begin(), end = impl->Libraries.end();
         it != end; ++it)
      {
      if(it->Target)
        {
        std::string genex =
          "$<TARGET_PROPERTY:" + *it + "," + prop + ">";
        cmGeneratorExpression ge(&it->Backtrace);
        cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(
          new cmTargetInternals::TargetPropertyEntry(cge, *it));
        }
      }
    }
}